

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_avx2.c
# Opt level: O3

void av1_highbd_convolve_2d_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  int16_t *piVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  undefined1 (*pauVar24) [32];
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [32];
  long lVar27;
  int iVar28;
  undefined2 uVar29;
  long lVar30;
  undefined2 uVar31;
  int iVar32;
  ulong uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  int16_t im_block [1120];
  undefined1 (*local_a68) [32];
  undefined1 (*local_a60) [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  
  uVar4 = filter_params_x->taps;
  if (uVar4 == 0xc) {
    av1_highbd_convolve_2d_sr_ssse3
              (src,src_stride,dst,dst_stride,w,h,filter_params_x,filter_params_y,subpel_x_qn,
               subpel_y_qn,conv_params,bd);
  }
  else {
    bVar22 = (byte)conv_params->round_0;
    uVar23 = 0xe - (conv_params->round_0 + conv_params->round_1);
    uVar31 = 0xff;
    if (bd == 0xc) {
      uVar31 = 0xfff;
    }
    uVar29 = 0x3ff;
    if (bd != 10) {
      uVar29 = uVar31;
    }
    if (0 < w) {
      iVar20 = ((1 << (bVar22 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f));
      iVar32 = ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1) +
               (-1 << (~bVar22 + (char)bd + 0xe & 0x1f));
      uVar5 = filter_params_y->taps;
      uVar6 = conv_params->round_0;
      uVar7 = conv_params->round_1;
      iVar28 = h + (uint)uVar5 + -1;
      uVar33 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar5);
      auVar38._4_4_ = iVar20;
      auVar38._0_4_ = iVar20;
      auVar38._8_4_ = iVar20;
      auVar38._12_4_ = iVar20;
      auVar38._16_4_ = iVar20;
      auVar38._20_4_ = iVar20;
      auVar38._24_4_ = iVar20;
      auVar38._28_4_ = iVar20;
      iVar20 = (1 << ((byte)uVar23 & 0x1f)) >> 1;
      piVar8 = filter_params_y->filter_ptr;
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 6);
      auVar40._4_4_ = uVar1;
      auVar40._0_4_ = uVar1;
      auVar40._8_4_ = uVar1;
      auVar40._12_4_ = uVar1;
      auVar40._16_4_ = uVar1;
      auVar40._20_4_ = uVar1;
      auVar40._24_4_ = uVar1;
      auVar40._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 4);
      auVar41._4_4_ = uVar1;
      auVar41._0_4_ = uVar1;
      auVar41._8_4_ = uVar1;
      auVar41._12_4_ = uVar1;
      auVar41._16_4_ = uVar1;
      auVar41._20_4_ = uVar1;
      auVar41._24_4_ = uVar1;
      auVar41._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 2);
      auVar43 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      uVar1 = *(undefined4 *)(piVar8 + uVar33);
      auVar44._4_4_ = uVar1;
      auVar44._0_4_ = uVar1;
      auVar44._8_4_ = uVar1;
      auVar44._12_4_ = uVar1;
      auVar44._16_4_ = uVar1;
      auVar44._20_4_ = uVar1;
      auVar44._24_4_ = uVar1;
      auVar44._28_4_ = uVar1;
      piVar8 = filter_params_x->filter_ptr;
      uVar33 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar4);
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 6);
      auVar39._4_4_ = uVar1;
      auVar39._0_4_ = uVar1;
      auVar39._8_4_ = uVar1;
      auVar39._12_4_ = uVar1;
      auVar39._16_4_ = uVar1;
      auVar39._20_4_ = uVar1;
      auVar39._24_4_ = uVar1;
      auVar39._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 4);
      auVar45._4_4_ = uVar1;
      auVar45._0_4_ = uVar1;
      auVar45._8_4_ = uVar1;
      auVar45._12_4_ = uVar1;
      auVar45._16_4_ = uVar1;
      auVar45._20_4_ = uVar1;
      auVar45._24_4_ = uVar1;
      auVar45._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar8 + uVar33 + 2);
      uVar2 = *(undefined4 *)(piVar8 + uVar33);
      auVar35._4_4_ = uVar2;
      auVar35._0_4_ = uVar2;
      auVar35._8_4_ = uVar2;
      auVar35._12_4_ = uVar2;
      auVar35._16_4_ = uVar2;
      auVar35._20_4_ = uVar2;
      auVar35._24_4_ = uVar2;
      auVar35._28_4_ = uVar2;
      lVar21 = (long)dst_stride;
      local_a68 = (undefined1 (*) [32])
                  ((long)src +
                  (2 - ((ulong)(uVar4 >> 1) * 2 + (long)(int)(((uVar5 >> 1) - 1) * src_stride) * 2))
                  );
      uVar33 = 0;
      local_a60 = (undefined1 (*) [16])dst;
      do {
        if (0 < iVar28) {
          pauVar24 = (undefined1 (*) [32])local_920;
          pauVar26 = local_a68;
          lVar27 = 1;
          do {
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            if (lVar27 < iVar28) {
              auVar36 = *(undefined1 (*) [32])(*pauVar26 + (long)src_stride * 2);
            }
            auVar3 = *pauVar26;
            auVar37._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar3._0_16_;
            auVar37._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * auVar36._0_16_;
            auVar13 = vperm2i128_avx2(auVar3,auVar36,0x31);
            auVar36 = vpalignr_avx2(auVar13,auVar37,4);
            auVar3 = vpalignr_avx2(auVar13,auVar37,8);
            auVar9 = vpalignr_avx2(auVar13,auVar37,0xc);
            auVar10 = vpmaddwd_avx2(auVar37,auVar35);
            auVar12._4_4_ = uVar1;
            auVar12._0_4_ = uVar1;
            auVar12._8_4_ = uVar1;
            auVar12._12_4_ = uVar1;
            auVar12._16_4_ = uVar1;
            auVar12._20_4_ = uVar1;
            auVar12._24_4_ = uVar1;
            auVar12._28_4_ = uVar1;
            auVar11 = vpmaddwd_avx2(auVar12,auVar36);
            auVar36 = vpmaddwd_avx2(auVar45,auVar3);
            auVar3 = vpmaddwd_avx2(auVar39,auVar9);
            auVar36 = vpaddd_avx2(auVar36,auVar3);
            auVar3 = vpaddd_avx2(auVar38,auVar10);
            auVar3 = vpaddd_avx2(auVar3,auVar11);
            auVar36 = vpaddd_avx2(auVar3,auVar36);
            auVar36 = vpsrad_avx2(auVar36,ZEXT416(uVar6));
            auVar36 = vpackssdw_avx2(auVar36,ZEXT432(uVar6));
            auVar3 = vpalignr_avx2(auVar13,auVar37,2);
            auVar9 = vpalignr_avx2(auVar13,auVar37,6);
            auVar10 = vpalignr_avx2(auVar13,auVar37,10);
            auVar11 = vpalignr_avx2(auVar13,auVar37,0xe);
            auVar13 = vpmaddwd_avx2(auVar3,auVar35);
            auVar3 = vpmaddwd_avx2(auVar12,auVar9);
            auVar9 = vpmaddwd_avx2(auVar45,auVar10);
            auVar3 = vpaddd_avx2(auVar3,auVar9);
            auVar10 = vpmaddwd_avx2(auVar39,auVar11);
            auVar9 = vpaddd_avx2(auVar38,auVar13);
            auVar3 = vpaddd_avx2(auVar9,auVar3);
            auVar3 = vpaddd_avx2(auVar3,auVar10);
            auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar6));
            auVar3 = vpackssdw_avx2(auVar3,ZEXT432(uVar6));
            auVar36 = vpunpcklwd_avx2(auVar36,auVar3);
            *pauVar24 = auVar36;
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)src_stride * 4);
            pauVar24 = pauVar24 + 1;
            lVar30 = lVar27 + 1;
            lVar27 = lVar27 + 2;
          } while (lVar30 < iVar28);
        }
        auVar34 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32,
                                                  CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,
                                                  iVar32))))))));
        if (0 < h) {
          auVar10._16_16_ = auStack_8d0;
          auVar10._0_16_ = local_8e0;
          auVar42._16_16_ = local_8c0;
          auVar42._0_16_ = auStack_8d0;
          auVar36 = vpunpckhwd_avx2(auVar10,auVar42);
          auVar11._16_16_ = auStack_8f0;
          auVar11._0_16_ = local_900;
          auVar19._16_16_ = local_8e0;
          auVar19._0_16_ = auStack_8f0;
          auVar9 = vpunpckhwd_avx2(auVar11,auVar19);
          auVar13._16_16_ = auStack_910;
          auVar13._0_16_ = local_920;
          auVar18._16_16_ = local_900;
          auVar18._0_16_ = auStack_910;
          auVar3 = vpunpckhwd_avx2(auVar13,auVar18);
          auVar10 = vpunpcklwd_avx2(auVar10,auVar42);
          auVar11 = vpunpcklwd_avx2(auVar11,auVar19);
          auVar13 = vpunpcklwd_avx2(auVar13,auVar18);
          pauVar24 = (undefined1 (*) [32])auStack_8b0;
          lVar27 = 0;
          pauVar25 = local_a60;
          do {
            auVar19 = auVar10;
            auVar18 = auVar36;
            auVar10 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar24[-1] + 0x10),*pauVar24);
            auVar36 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar24[-1] + 0x10),*pauVar24);
            auVar42 = auVar43._0_32_;
            auVar12 = vpmaddwd_avx2(auVar42,auVar11);
            auVar37 = vpmaddwd_avx2(auVar41,auVar19);
            auVar12 = vpaddd_avx2(auVar12,auVar37);
            auVar13 = vpmaddwd_avx2(auVar44,auVar13);
            auVar13 = vpaddd_avx2(auVar13,auVar34._0_32_);
            auVar13 = vpaddd_avx2(auVar12,auVar13);
            auVar12 = vpmaddwd_avx2(auVar40,auVar10);
            auVar13 = vpaddd_avx2(auVar12,auVar13);
            auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar7));
            auVar17._4_4_ = iVar20;
            auVar17._0_4_ = iVar20;
            auVar17._8_4_ = iVar20;
            auVar17._12_4_ = iVar20;
            auVar17._16_4_ = iVar20;
            auVar17._20_4_ = iVar20;
            auVar17._24_4_ = iVar20;
            auVar17._28_4_ = iVar20;
            auVar13 = vpaddd_avx2(auVar17,auVar13);
            auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar23));
            if ((long)uVar33 < (long)((ulong)(uint)w - 4)) {
              auVar12 = vpmaddwd_avx2(auVar42,auVar9);
              auVar37 = vpmaddwd_avx2(auVar41,auVar18);
              auVar12 = vpaddd_avx2(auVar12,auVar37);
              auVar3 = vpmaddwd_avx2(auVar3,auVar44);
              auVar14._4_4_ = iVar32;
              auVar14._0_4_ = iVar32;
              auVar14._8_4_ = iVar32;
              auVar14._12_4_ = iVar32;
              auVar14._16_4_ = iVar32;
              auVar14._20_4_ = iVar32;
              auVar14._24_4_ = iVar32;
              auVar14._28_4_ = iVar32;
              auVar3 = vpaddd_avx2(auVar3,auVar14);
              auVar3 = vpaddd_avx2(auVar3,auVar12);
              auVar12 = vpmaddwd_avx2(auVar36,auVar40);
              auVar3 = vpaddd_avx2(auVar3,auVar12);
              auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar7));
              auVar3 = vpaddd_avx2(auVar3,auVar17);
              auVar43 = ZEXT3264(auVar42);
              auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar23));
              auVar34 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32
                                                  ,CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,
                                                  iVar32))))))));
              auVar3 = vpackssdw_avx2(auVar13,auVar3);
              auVar15._2_2_ = uVar29;
              auVar15._0_2_ = uVar29;
              auVar15._4_2_ = uVar29;
              auVar15._6_2_ = uVar29;
              auVar15._8_2_ = uVar29;
              auVar15._10_2_ = uVar29;
              auVar15._12_2_ = uVar29;
              auVar15._14_2_ = uVar29;
              auVar15._16_2_ = uVar29;
              auVar15._18_2_ = uVar29;
              auVar15._20_2_ = uVar29;
              auVar15._22_2_ = uVar29;
              auVar15._24_2_ = uVar29;
              auVar15._26_2_ = uVar29;
              auVar15._28_2_ = uVar29;
              auVar15._30_2_ = uVar29;
              auVar3 = vpminsw_avx2(auVar3,auVar15);
              auVar3 = vpmaxsw_avx2(auVar3,_DAT_0050f3c0);
              *pauVar25 = auVar3._0_16_;
              *(undefined1 (*) [16])((long)*pauVar25 + lVar21 * 2) = auVar3._16_16_;
            }
            else {
              auVar3 = vpackssdw_avx2(auVar13,auVar13);
              auVar16._2_2_ = uVar29;
              auVar16._0_2_ = uVar29;
              auVar16._4_2_ = uVar29;
              auVar16._6_2_ = uVar29;
              auVar16._8_2_ = uVar29;
              auVar16._10_2_ = uVar29;
              auVar16._12_2_ = uVar29;
              auVar16._14_2_ = uVar29;
              auVar16._16_2_ = uVar29;
              auVar16._18_2_ = uVar29;
              auVar16._20_2_ = uVar29;
              auVar16._22_2_ = uVar29;
              auVar16._24_2_ = uVar29;
              auVar16._26_2_ = uVar29;
              auVar16._28_2_ = uVar29;
              auVar16._30_2_ = uVar29;
              auVar3 = vpminsw_avx2(auVar3,auVar16);
              auVar3 = vpmaxsw_avx2(auVar3,_DAT_0050f3c0);
              if (w == 4) {
                *(long *)*pauVar25 = auVar3._0_8_;
                *(long *)((long)*pauVar25 + lVar21 * 2) = auVar3._16_8_;
              }
              else {
                *(int *)*pauVar25 = auVar3._0_4_;
                *(int *)((long)*pauVar25 + lVar21 * 2) = auVar3._16_4_;
              }
            }
            lVar27 = lVar27 + 2;
            pauVar25 = (undefined1 (*) [16])((long)*pauVar25 + lVar21 * 2 * 2);
            pauVar24 = pauVar24 + 1;
            auVar13 = auVar11;
            auVar3 = auVar9;
            auVar9 = auVar18;
            auVar11 = auVar19;
          } while (lVar27 < h);
        }
        uVar33 = uVar33 + 8;
        local_a68 = (undefined1 (*) [32])(*local_a68 + 0x10);
        local_a60 = local_a60 + 1;
      } while (uVar33 < (uint)w);
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_avx2(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn,
                                    const int subpel_y_qn,
                                    ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_2d_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                    filter_params_x, filter_params_y,
                                    subpel_x_qn, subpel_y_qn, conv_params, bd);
    return;
  }

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);
        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);
          res_b_round =
              _mm256_sra_epi32(_mm256_add_epi32(res_b_round, round_const_bits),
                               round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}